

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  char *pcVar6;
  byte *pbVar7;
  uint32_t uVar8;
  
  uVar2 = (ctx->sb).p.ptr32;
  pbVar7 = (byte *)(ulong)uVar2;
  if ((ctx->sb).e.ptr32 - uVar2 < 0xb) {
    pbVar7 = (byte *)lj_buf_more2(&ctx->sb,0xb);
  }
  uVar2 = (o->field_2).it;
  if (uVar2 == 0xfffffffb) {
    uVar2 = (o->u32).lo;
    uVar3 = *(uint *)((ulong)uVar2 + 0xc);
    uVar8 = uVar3 + 5;
    uVar4 = (ctx->sb).p.ptr32;
    pcVar6 = (char *)(ulong)uVar4;
    if ((ctx->sb).e.ptr32 - uVar4 < uVar8) {
      pcVar6 = lj_buf_more2(&ctx->sb,uVar8);
    }
    pcVar6 = lj_strfmt_wuleb128(pcVar6,uVar8);
    memcpy(pcVar6,(void *)((ulong)uVar2 + 0x10),(ulong)uVar3);
    uVar8 = (int)pcVar6 + uVar3;
  }
  else if (uVar2 < 0xfffeffff) {
    if (narrow != 0) {
      dVar1 = o->n;
      dVar5 = (double)(int)dVar1;
      if ((dVar1 == dVar5) && (!NAN(dVar1) && !NAN(dVar5))) {
        *pbVar7 = 3;
        pbVar7 = (byte *)lj_strfmt_wuleb128((char *)(pbVar7 + 1),(int)dVar1);
        (ctx->sb).p.ptr32 = (uint32_t)pbVar7;
      }
      if ((dVar1 == dVar5) && (!NAN(dVar1) && !NAN(dVar5))) {
        return;
      }
    }
    *pbVar7 = 4;
    pcVar6 = lj_strfmt_wuleb128((char *)(pbVar7 + 1),(o->u32).lo);
    pcVar6 = lj_strfmt_wuleb128(pcVar6,(o->field_2).it);
    uVar8 = (uint32_t)pcVar6;
  }
  else {
    *pbVar7 = ~(byte)uVar2;
    uVar8 = (int)pbVar7 + 1;
  }
  (ctx->sb).p.ptr32 = uVar8;
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  char *p = lj_buf_more(&ctx->sb, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    p = lj_buf_more(&ctx->sb, 5+len);
    p = lj_strfmt_wuleb128(p, BCDUMP_KTAB_STR+len);
    p = lj_buf_wmem(p, strdata(str), len);
  } else if (tvisint(o)) {
    *p++ = BCDUMP_KTAB_INT;
    p = lj_strfmt_wuleb128(p, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	*p++ = BCDUMP_KTAB_INT;
	p = lj_strfmt_wuleb128(p, k);
	setsbufP(&ctx->sb, p);
	return;
      }
    }
    *p++ = BCDUMP_KTAB_NUM;
    p = lj_strfmt_wuleb128(p, o->u32.lo);
    p = lj_strfmt_wuleb128(p, o->u32.hi);
  } else {
    lj_assertBCW(tvispri(o), "unhandled type %d", itype(o));
    *p++ = BCDUMP_KTAB_NIL+~itype(o);
  }
  setsbufP(&ctx->sb, p);
}